

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O1

int lws_serve_http_file_fragment(lws *wsi)

{
  lws_filepos_t *plVar1;
  char cVar2;
  byte bVar3;
  lws_context *plVar4;
  ulong uVar5;
  uchar *puVar6;
  lws_fop_fd_t plVar7;
  lws_plat_file_ops *plVar8;
  lws_callback_function *callback_function;
  uint8_t *puVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  char *pcVar15;
  lws_fileofs_t lVar16;
  ulong uVar17;
  uint8_t *buf;
  lws_filepos_t lVar18;
  lws_filepos_t amount;
  lws_process_html_args args;
  lws_filepos_t local_60;
  lws_context *local_58;
  uint8_t *local_50;
  uint local_48;
  int local_44;
  uint local_40;
  uint local_3c;
  uchar **local_38;
  
  plVar4 = (wsi->a).context;
  cVar2 = wsi->tsi;
  _lws_log(0x10,"wsi->mux_substream %d\n",(ulong)(*(uint *)&wsi->field_0x46e >> 1 & 1));
  local_38 = &plVar4->pt[cVar2].serv_buf;
  local_58 = plVar4;
  do {
    if (wsi->buflist_out != (lws_buflist *)0x0) {
      iVar12 = lws_issue_raw(wsi,(uchar *)0x0,0);
      if (iVar12 < 0) {
        _lws_log(8,"%s: closing\n","lws_serve_http_file_fragment");
        goto LAB_00121e13;
      }
      break;
    }
    if ((wsi->http).filepos != (wsi->http).filelen) {
      uVar14 = (ulong)(local_58->pt_serv_buf_size - 9);
      if (((wsi->http).tx_content_length != 0) &&
         (uVar5 = (wsi->http).tx_content_remain, uVar5 < uVar14)) {
        uVar14 = uVar5;
      }
      uVar5 = ((wsi->a).protocol)->tx_packet_size;
      uVar17 = uVar5;
      if (uVar14 < uVar5) {
        uVar17 = uVar14;
      }
      if (uVar5 == 0) {
        uVar17 = uVar14;
      }
      puVar6 = *local_38;
      bVar3 = wsi->role_ops->rops_idx[4];
      if ((bVar3 & 0xf) != 0) {
        uVar11 = (*wsi->role_ops->rops_table[(bVar3 & 0xf) - 1].check_upgrades)(wsi);
        if (uVar11 == 0) {
          pcVar15 = lws_wsi_tag(wsi);
          _lws_log(4,"%s: %s: no tx credit\n","lws_serve_http_file_fragment",pcVar15);
        }
        else if (uVar11 <= uVar17) {
          uVar17 = (ulong)uVar11;
        }
        if (uVar11 == 0) {
          return 0;
        }
      }
      buf = puVar6 + 9;
      lVar18 = uVar17 - 0x8a;
      puVar9 = puVar6 + 0x13;
      if ((*(uint *)&wsi->field_0x46e >> 0x14 & 1) == 0) {
        lVar18 = uVar17;
        puVar9 = buf;
      }
      local_60 = 0;
      plVar7 = (wsi->http).fop_fd;
      iVar12 = (*plVar7->fops->read)(plVar7,&local_60,puVar9,lVar18);
      if (iVar12 < 0) goto LAB_00121e13;
      iVar12 = (int)puVar9 - (int)buf;
      if ((*(uint *)&wsi->field_0x46e >> 0x14 & 1) != 0) {
        iVar12 = 0;
      }
      iVar10 = (int)local_60;
      _lws_log(0x10,"%s: sending %d\n","lws_serve_http_file_fragment",
               (ulong)(uint)(iVar12 + (int)local_60));
      uVar11 = iVar12 + iVar10;
      if (uVar11 != 0) {
        lws_set_timeout(wsi,PENDING_TIMEOUT_HTTP_CONTENT,local_58->timeout_secs);
        uVar13 = (uint)*(undefined8 *)&wsi->field_0x46e;
        if ((uVar13 >> 0x15 & 1) != 0) {
          local_44 = (int)lVar18 + 0x80;
          local_40 = (uint)((ulong)uVar11 + (wsi->http).filepos == (wsi->http).filelen);
          local_3c = uVar13 >> 0x14 & 1;
          local_50 = puVar9;
          local_48 = uVar11;
          iVar12 = user_callback_handle_rxflow
                             (((wsi->a).vhost)->protocols[wsi->protocol_interpret_idx].callback,wsi,
                              LWS_CALLBACK_PROCESS_HTML,wsi->user_space,&local_50,0);
          buf = local_50;
          uVar11 = local_48;
          if (iVar12 < 0) goto LAB_00121e13;
        }
        iVar12 = lws_write(wsi,buf,(ulong)uVar11,
                           (uint)(local_60 + (wsi->http).filepos == (wsi->http).filelen) * 4 +
                           LWS_WRITE_HTTP);
        if (iVar12 < 0) {
LAB_00121e13:
          plVar7 = (wsi->http).fop_fd;
          if (plVar7 == (lws_fop_fd_t)0x0) {
            return -1;
          }
          plVar8 = plVar7->fops;
          if (plVar8 != (lws_plat_file_ops *)0x0) {
            (*plVar8->close)(&(wsi->http).fop_fd);
            return -1;
          }
          return -1;
        }
        plVar1 = &(wsi->http).filepos;
        *plVar1 = *plVar1 + local_60;
        if ((iVar12 - uVar11 != 0) &&
           (plVar7 = (wsi->http).fop_fd,
           lVar16 = (*plVar7->fops->seek_cur)(plVar7,(long)(int)(iVar12 - uVar11)), lVar16 == -1))
        goto LAB_00121e13;
      }
    }
    if ((wsi->buflist_out == (lws_buflist *)0x0) && ((wsi->http).filelen <= (wsi->http).filepos)) {
      lwsi_set_state(wsi,0x119);
      plVar7 = (wsi->http).fop_fd;
      if ((plVar7 != (lws_fop_fd_t)0x0) &&
         (plVar8 = plVar7->fops, plVar8 != (lws_plat_file_ops *)0x0)) {
        (*plVar8->close)(&(wsi->http).fop_fd);
      }
      _lws_log(0x10,"file completed\n");
      callback_function = ((wsi->a).protocol)->callback;
      if (callback_function != (lws_callback_function *)0x0) {
        iVar12 = user_callback_handle_rxflow
                           (callback_function,wsi,LWS_CALLBACK_HTTP_FILE_COMPLETION,wsi->user_space,
                            (void *)0x0,0);
        if (iVar12 < 0) {
          return -(uint)((wsi->field_0x46e & 2) == 0) | 1;
        }
        return 1;
      }
      return 1;
    }
    iVar12 = lws_send_pipe_choked(wsi);
  } while (iVar12 == 0);
  lws_callback_on_writable(wsi);
  return 0;
}

Assistant:

int lws_serve_http_file_fragment(struct lws *wsi)
{
	struct lws_context *context = wsi->a.context;
	struct lws_context_per_thread *pt = &context->pt[(int)wsi->tsi];
	struct lws_process_html_args args;
	lws_filepos_t amount, poss;
	unsigned char *p, *pstart;
#if defined(LWS_WITH_RANGES)
	unsigned char finished = 0;
#endif
	int n, m;

	lwsl_debug("wsi->mux_substream %d\n", wsi->mux_substream);

	do {

		/* priority 1: buffered output */

		if (lws_has_buffered_out(wsi)) {
			if (lws_issue_raw(wsi, NULL, 0) < 0) {
				lwsl_info("%s: closing\n", __func__);
				goto file_had_it;
			}
			break;
		}

		/* priority 2: buffered pre-compression-transform */

#if defined(LWS_WITH_HTTP_STREAM_COMPRESSION)
	if (wsi->http.comp_ctx.buflist_comp ||
	    wsi->http.comp_ctx.may_have_more) {
		enum lws_write_protocol wp = LWS_WRITE_HTTP;

		lwsl_info("%s: completing comp partial (buflist %p, may %d)\n",
			   __func__, wsi->http.comp_ctx.buflist_comp,
			   wsi->http.comp_ctx.may_have_more);

		if (lws_rops_fidx(wsi->role_ops, LWS_ROPS_write_role_protocol) &&
		    lws_rops_func_fidx(wsi->role_ops, LWS_ROPS_write_role_protocol).
					write_role_protocol(wsi, NULL, 0, &wp) < 0) {
			lwsl_info("%s signalling to close\n", __func__);
			goto file_had_it;
		}
		lws_callback_on_writable(wsi);

		break;
	}
#endif

		if (wsi->http.filepos == wsi->http.filelen)
			goto all_sent;

		n = 0;
		p = pstart = pt->serv_buf + LWS_H2_FRAME_HEADER_LENGTH;

#if defined(LWS_WITH_RANGES)
		if (wsi->http.range.count_ranges && !wsi->http.range.inside) {

			lwsl_notice("%s: doing range start %llu\n", __func__,
				    wsi->http.range.start);

			if ((long long)lws_vfs_file_seek_cur(wsi->http.fop_fd,
						   (lws_fileofs_t)wsi->http.range.start -
						   (lws_fileofs_t)wsi->http.filepos) < 0)
				goto file_had_it;

			wsi->http.filepos = wsi->http.range.start;

			if (wsi->http.range.count_ranges > 1) {
				n =  lws_snprintf((char *)p,
						context->pt_serv_buf_size -
						LWS_H2_FRAME_HEADER_LENGTH,
					"_lws\x0d\x0a"
					"Content-Type: %s\x0d\x0a"
					"Content-Range: bytes "
						"%llu-%llu/%llu\x0d\x0a"
					"\x0d\x0a",
					wsi->http.multipart_content_type,
					wsi->http.range.start,
					wsi->http.range.end,
					wsi->http.range.extent);
				p += n;
			}

			wsi->http.range.budget = wsi->http.range.end -
						   wsi->http.range.start + 1;
			wsi->http.range.inside = 1;
		}
#endif

		poss = context->pt_serv_buf_size - (unsigned int)n -
				LWS_H2_FRAME_HEADER_LENGTH;

		if (wsi->http.tx_content_length)
			if (poss > wsi->http.tx_content_remain)
				poss = wsi->http.tx_content_remain;

		/*
		 * If there is a hint about how much we will do well to send at
		 * one time, restrict ourselves to only trying to send that.
		 */
		if (wsi->a.protocol->tx_packet_size &&
		    poss > wsi->a.protocol->tx_packet_size)
			poss = wsi->a.protocol->tx_packet_size;

		if (lws_rops_fidx(wsi->role_ops, LWS_ROPS_tx_credit)) {
			lws_filepos_t txc = (unsigned int)lws_rops_func_fidx(wsi->role_ops,
							       LWS_ROPS_tx_credit).
					tx_credit(wsi, LWSTXCR_US_TO_PEER, 0);

			if (!txc) {
				/*
				 * We shouldn't've been able to get the
				 * WRITEABLE if we are skint
				 */
				lwsl_notice("%s: %s: no tx credit\n", __func__,
						lws_wsi_tag(wsi));

				return 0;
			}
			if (txc < poss)
				poss = txc;

			/*
			 * Tracking consumption of the actual payload amount
			 * will be handled when the role data frame is sent...
			 */
		}

#if defined(LWS_WITH_RANGES)
		if (wsi->http.range.count_ranges) {
			if (wsi->http.range.count_ranges > 1)
				poss -= 7; /* allow for final boundary */
			if (poss > wsi->http.range.budget)
				poss = wsi->http.range.budget;
		}
#endif
		if (wsi->sending_chunked) {
			/* we need to drop the chunk size in here */
			p += 10;
			/* allow for the chunk to grow by 128 in translation */
			poss -= 10 + 128;
		}

		amount = 0;
		if (lws_vfs_file_read(wsi->http.fop_fd, &amount, p, poss) < 0)
			goto file_had_it; /* caller will close */

		if (wsi->sending_chunked)
			n = (int)amount;
		else
			n = lws_ptr_diff(p, pstart) + (int)amount;

		lwsl_debug("%s: sending %d\n", __func__, n);

		if (n) {
			lws_set_timeout(wsi, PENDING_TIMEOUT_HTTP_CONTENT,
					(int)context->timeout_secs);

			if (wsi->interpreting) {
				args.p = (char *)p;
				args.len = n;
				args.max_len = (int)(unsigned int)poss + 128;
				args.final = wsi->http.filepos + (unsigned int)n ==
							wsi->http.filelen;
				args.chunked = wsi->sending_chunked;
				if (user_callback_handle_rxflow(
				     wsi->a.vhost->protocols[
				     (int)wsi->protocol_interpret_idx].callback,
				     wsi, LWS_CALLBACK_PROCESS_HTML,
				     wsi->user_space, &args, 0) < 0)
					goto file_had_it;
				n = args.len;
				p = (unsigned char *)args.p;
			} else
				p = pstart;

#if defined(LWS_WITH_RANGES)
			if (wsi->http.range.send_ctr + 1 ==
				wsi->http.range.count_ranges && // last range
			    wsi->http.range.count_ranges > 1 && // was 2+ ranges (ie, multipart)
			    wsi->http.range.budget - amount == 0) {// final part
				n += lws_snprintf((char *)pstart + n, 6,
					"_lws\x0d\x0a"); // append trailing boundary
				lwsl_debug("added trailing boundary\n");
			}
#endif
			m = lws_write(wsi, p, (unsigned int)n, wsi->http.filepos + amount ==
					wsi->http.filelen ?
					 LWS_WRITE_HTTP_FINAL : LWS_WRITE_HTTP);
			if (m < 0)
				goto file_had_it;

			wsi->http.filepos += amount;

#if defined(LWS_WITH_RANGES)
			if (wsi->http.range.count_ranges >= 1) {
				wsi->http.range.budget -= amount;
				if (wsi->http.range.budget == 0) {
					lwsl_notice("range budget exhausted\n");
					wsi->http.range.inside = 0;
					wsi->http.range.send_ctr++;

					if (lws_ranges_next(&wsi->http.range) < 1) {
						finished = 1;
						goto all_sent;
					}
				}
			}
#endif

			if (m != n) {
				/* adjust for what was not sent */
				if (lws_vfs_file_seek_cur(wsi->http.fop_fd,
							   m - n) ==
							     (lws_fileofs_t)-1)
					goto file_had_it;
			}
		}

all_sent:
		if ((!lws_has_buffered_out(wsi)
#if defined(LWS_WITH_HTTP_STREAM_COMPRESSION)
				&& !wsi->http.comp_ctx.buflist_comp &&
		    !wsi->http.comp_ctx.may_have_more
#endif
		    ) && (wsi->http.filepos >= wsi->http.filelen
#if defined(LWS_WITH_RANGES)
		    || finished)
#else
		)
#endif
		) {
			lwsi_set_state(wsi, LRS_ESTABLISHED);
			/* we might be in keepalive, so close it off here */
			lws_vfs_file_close(&wsi->http.fop_fd);

			lwsl_debug("file completed\n");

			if (wsi->a.protocol->callback &&
			    user_callback_handle_rxflow(wsi->a.protocol->callback,
					wsi, LWS_CALLBACK_HTTP_FILE_COMPLETION,
					wsi->user_space, NULL, 0) < 0) {
					/*
					 * For http/1.x, the choices from
					 * transaction_completed are either
					 * 0 to use the connection for pipelined
					 * or nonzero to hang it up.
					 *
					 * However for http/2. while we are
					 * still interested in hanging up the
					 * nwsi if there was a network-level
					 * fatal error, simply completing the
					 * transaction is a matter of the stream
					 * state, not the root connection at the
					 * network level
					 */
					if (wsi->mux_substream)
						return 1;
					else
						return -1;
				}

			return 1;  /* >0 indicates completed */
		}
		/*
		 * while(1) here causes us to spam the whole file contents into
		 * a hugely bloated output buffer if it ever can't send the
		 * whole chunk...
		 */
	} while (!lws_send_pipe_choked(wsi));

	lws_callback_on_writable(wsi);

	return 0; /* indicates further processing must be done */

file_had_it:
	lws_vfs_file_close(&wsi->http.fop_fd);

	return -1;
}